

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiOutAlsa::sendMessage(MidiOutAlsa *this,uchar *message,size_t size)

{
  undefined8 *puVar1;
  pointer pcVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  _Alloc_hider _Var8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  snd_seq_event_t ev;
  undefined8 local_f8;
  undefined4 uStack_f0;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined2 uStack_ea;
  undefined4 uStack_e8;
  undefined8 uStack_e4;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  puVar1 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  uVar9 = (uint)size;
  if (*(uint *)(puVar1 + 4) < uVar9) {
    *(uint *)(puVar1 + 4) = uVar9;
    iVar3 = snd_midi_event_resize_buffer(puVar1[3]);
    if (iVar3 == 0) {
      free((void *)puVar1[5]);
      pvVar4 = malloc((ulong)*(uint *)(puVar1 + 4));
      puVar1[5] = pvVar4;
      if (pvVar4 != (void *)0x0) goto LAB_0018e907;
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x1bdcd4);
      paVar10 = &local_70.field_2;
      pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,
                 pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_70);
      _Var8._M_p = local_70._M_dataplus._M_p;
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x1bded5);
      paVar10 = &local_50.field_2;
      pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,
                 pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_50);
      _Var8._M_p = local_50._M_dataplus._M_p;
    }
LAB_0018eaeb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != paVar10) {
      operator_delete(_Var8._M_p);
    }
  }
  else {
    if (uVar9 != 0) {
LAB_0018e907:
      uVar6 = 0;
      do {
        *(uchar *)(puVar1[5] + uVar6) = message[uVar6];
        uVar6 = uVar6 + 1;
      } while ((size & 0xffffffff) != uVar6);
      uVar7 = 0;
      do {
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_f0 = 0;
        uStack_ec = 0;
        uStack_eb = *(undefined1 *)((long)puVar1 + 0xc);
        uStack_ea = 0xfdfe;
        local_f8 = 0xfd000000;
        lVar5 = snd_midi_event_encode(puVar1[3],(ulong)uVar7 + puVar1[5],uVar9 - uVar7,&local_f8);
        if (lVar5 < 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                     (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                     0x1bdf16);
          paVar10 = &local_90.field_2;
          pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)paVar10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,
                     pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
          MidiApi::error((MidiApi *)this,WARNING,&local_90);
          _Var8._M_p = local_90._M_dataplus._M_p;
          goto LAB_0018eaeb;
        }
        if ((char)local_f8 == -1) {
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                     (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                     0x1bdf45);
          paVar10 = &local_b0.field_2;
          pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
          local_b0._M_dataplus._M_p = (pointer)paVar10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar2,
                     pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
          MidiApi::error((MidiApi *)this,WARNING,&local_b0);
          _Var8._M_p = local_b0._M_dataplus._M_p;
          goto LAB_0018eaeb;
        }
        iVar3 = snd_seq_event_output(*puVar1);
        if (iVar3 < 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                     (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                     0x1bdf73);
          paVar10 = &local_d0.field_2;
          pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
          local_d0._M_dataplus._M_p = (pointer)paVar10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar2,
                     pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
          MidiApi::error((MidiApi *)this,WARNING,&local_d0);
          _Var8._M_p = local_d0._M_dataplus._M_p;
          goto LAB_0018eaeb;
        }
        uVar7 = uVar7 + (int)lVar5;
      } while (uVar7 < uVar9);
    }
    snd_seq_drain_output(*puVar1);
  }
  return;
}

Assistant:

void MidiOutAlsa :: sendMessage( const unsigned char *message, size_t size )
{
  long result;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  unsigned int nBytes = static_cast<unsigned int> (size);
  if ( nBytes > data->bufferSize ) {
    data->bufferSize = nBytes;
    result = snd_midi_event_resize_buffer( data->coder, nBytes );
    if ( result != 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    free (data->buffer);
    data->buffer = (unsigned char *) malloc( data->bufferSize );
    if ( data->buffer == NULL ) {
      errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
      error( RtMidiError::MEMORY_ERROR, errorString_ );
      return;
    }
  }

  for ( unsigned int i=0; i<nBytes; ++i ) data->buffer[i] = message[i];

  unsigned int offset = 0;
  while (offset < nBytes) {
    snd_seq_event_t ev;
    snd_seq_ev_clear( &ev );
    snd_seq_ev_set_source( &ev, data->vport );
    snd_seq_ev_set_subs( &ev );
    snd_seq_ev_set_direct( &ev );
    result = snd_midi_event_encode( data->coder, data->buffer + offset,
                                    (long)(nBytes - offset), &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: event parsing error!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    if ( ev.type == SND_SEQ_EVENT_NONE ) {
      errorString_ = "MidiOutAlsa::sendMessage: incomplete message!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    offset += result;

    // Send the event.
    result = snd_seq_event_output( data->seq, &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: error sending MIDI message to port.";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }
  }
  snd_seq_drain_output( data->seq );
}